

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chest.cpp
# Opt level: O2

void Handlers::Chest_Open(Character *character,PacketReader *reader)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  __shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint uVar2;
  byte x;
  byte y;
  uint uVar3;
  uint uVar4;
  TileSpec TVar5;
  __shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _List_node_base *p_Var7;
  shared_ptr<Map_Chest> chest;
  PacketBuilder reply;
  
  x = PacketReader::GetChar(reader);
  y = PacketReader::GetChar(reader);
  uVar3 = (uint)character->x - (uint)x;
  uVar2 = -uVar3;
  if (0 < (int)uVar3) {
    uVar2 = uVar3;
  }
  uVar4 = (uint)character->y - (uint)y;
  uVar3 = -uVar4;
  if (0 < (int)uVar4) {
    uVar3 = uVar4;
  }
  if ((uVar3 & 0xff) + (uVar2 & 0xff) < 2) {
    TVar5 = Map::GetSpec(character->map,x,y);
    if (TVar5 == Chest) {
      PacketBuilder::PacketBuilder(&reply,PACKET_CHEST,PACKET_OPEN,2);
      PacketBuilder::AddChar(&reply,(uint)x);
      PacketBuilder::AddChar(&reply,(uint)y);
      p_Var1 = &((character->map->chests).
                 super__Vector_base<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>;
      this = &chest.super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      for (p_Var6 = &((character->map->chests).
                      super__Vector_base<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>; p_Var6 != p_Var1;
          p_Var6 = p_Var6 + 1) {
        std::__shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&chest.super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>,p_Var6);
        if (((chest.super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->x == x) &&
           ((chest.super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->y == y)) {
          PacketBuilder::ReserveMore
                    (&reply,((chest.super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             )->items).
                            super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>.
                            _M_impl._M_node._M_size * 5);
          p_Var7 = (_List_node_base *)
                   &(chest.super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->items;
          do {
            do {
              p_Var7 = (((_List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *)
                        &p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
              if (p_Var7 == (_List_node_base *)
                            &(chest.super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             )->items) {
                Character::Send(character,&reply);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
                goto LAB_0014593a;
              }
            } while (*(short *)&p_Var7[1]._M_next == 0);
            PacketBuilder::AddShort(&reply,(int)*(short *)&p_Var7[1]._M_next);
            PacketBuilder::AddThree(&reply,*(int *)((long)&p_Var7[1]._M_next + 4));
          } while( true );
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
      }
LAB_0014593a:
      PacketBuilder::~PacketBuilder(&reply);
    }
  }
  return;
}

Assistant:

void Chest_Open(Character *character, PacketReader &reader)
{
	int x = reader.GetChar();
	int y = reader.GetChar();

	if (util::path_length(character->x, character->y, x, y) <= 1)
	{
		if (character->map->GetSpec(x, y) == Map_Tile::Chest)
		{
			PacketBuilder reply(PACKET_CHEST, PACKET_OPEN, 2);
			reply.AddChar(x);
			reply.AddChar(y);

			UTIL_FOREACH(character->map->chests, chest)
			{
				if (chest->x == x && chest->y == y)
				{
					reply.ReserveMore(chest->items.size() * 5);

					UTIL_CIFOREACH(chest->items, item)
					{
						if (item->id != 0)
						{
							reply.AddShort(item->id);
							reply.AddThree(item->amount);
						}
					}

					character->Send(reply);
					break;
				}
			}
		}
	}
}